

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# primecandidate.c
# Opt level: O2

mp_int * pcs_generate(PrimeCandidateSource *s)

{
  uint32_t m;
  uint32_t uVar1;
  uint32_t uVar2;
  mp_int *a;
  mp_int *r;
  uint32_t uVar3;
  size_t i;
  ulong uVar4;
  
  if (s->ready == false) {
    __assert_fail("s->ready",
                  "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/keygen/primecandidate.c"
                  ,0x172,"mp_int *pcs_generate(PrimeCandidateSource *)");
  }
  if (s->one_shot == true) {
    if (s->thrown_away_my_shot != false) {
      return (mp_int *)0x0;
    }
    s->thrown_away_my_shot = true;
  }
  do {
    a = mp_random_upto_fn(s->limit,random_read);
    uVar4 = 0;
    uVar3 = 0;
    uVar2 = 0;
    do {
      if (s->navoids <= uVar4) {
        r = mp_new((ulong)s->bits);
        mp_mul_into(r,a,s->factor);
        mp_add_into(r,r,s->addend);
        mp_free(a);
        return r;
      }
      m = s->avoids[uVar4].mod;
      uVar1 = s->avoids[uVar4].res;
      if (uVar3 != m) {
        uVar2 = mp_mod_known_integer(a,m);
        uVar3 = m;
      }
      uVar4 = uVar4 + 1;
    } while (uVar2 != uVar1);
    mp_free(a);
  } while (s->one_shot == false);
  return (mp_int *)0x0;
}

Assistant:

mp_int *pcs_generate(PrimeCandidateSource *s)
{
    assert(s->ready);
    if (s->one_shot) {
        if (s->thrown_away_my_shot)
            return NULL;
        s->thrown_away_my_shot = true;
    }

    while (true) {
        mp_int *x = mp_random_upto(s->limit);

        int64_t x_res = 0, last_mod = 0;
        bool ok = true;

        for (size_t i = 0; i < s->navoids; i++) {
            int64_t mod = s->avoids[i].mod, avoid_res = s->avoids[i].res;

            if (mod != last_mod) {
                last_mod = mod;
                x_res = mp_mod_known_integer(x, mod);
            }

            if (x_res == avoid_res) {
                ok = false;
                break;
            }
        }

        if (!ok) {
            mp_free(x);
            if (s->one_shot)
                return NULL;
            continue; /* try a new x */
        }

        /*
         * We've found a viable x. Make the final output value.
         */
        mp_int *toret = mp_new(s->bits);
        mp_mul_into(toret, x, s->factor);
        mp_add_into(toret, toret, s->addend);
        mp_free(x);
        return toret;
    }
}